

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 68000.hpp
# Opt level: O0

void __thiscall
CPU::MC68000::Microcycle<1093U>::apply
          (Microcycle<1093U> *this,uint8_t *target,OperationT read_write_mask)

{
  OperationT read_write_mask_local;
  uint8_t *target_local;
  Microcycle<1093U> *this_local;
  
  switch(read_write_mask & 0x1f | 5) {
  case 0xd:
  case 0x1d:
    (this->value->field_1).b = *target;
    break;
  case 0xe:
  case 0x1e:
    *this->value = *(SlicedInt16 *)target;
    break;
  default:
    break;
  case 0x11:
  case 0x19:
    *target = (this->value->field_1).b;
    break;
  case 0x12:
  case 0x1a:
    *(SlicedInt16 *)target = *this->value;
  }
  return;
}

Assistant:

forceinline void apply(uint8_t *target, OperationT read_write_mask = Operation::PermitRead | Operation::PermitWrite) const {
		assert( (this->operation & (Operation::SelectWord | Operation::SelectByte)) != (Operation::SelectWord | Operation::SelectByte));

		switch(
			(this->operation | read_write_mask) &
			(Operation::SelectWord | Operation::SelectByte | Operation::Read | Operation::PermitRead | Operation::PermitWrite)
		) {
			default:
			break;

			case Operation::SelectWord | Operation::Read | Operation::PermitRead:
			case Operation::SelectWord | Operation::Read | Operation::PermitRead | Operation::PermitWrite:
				value->w = *reinterpret_cast<uint16_t *>(target);
			break;
			case Operation::SelectByte | Operation::Read | Operation::PermitRead:
			case Operation::SelectByte | Operation::Read | Operation::PermitRead | Operation::PermitWrite:
				value->b = *target;
			break;
			case Operation::SelectWord | Operation::PermitWrite:
			case Operation::SelectWord | Operation::PermitWrite | Operation::PermitRead:
				*reinterpret_cast<uint16_t *>(target) = value->w;
			break;
			case Operation::SelectByte | Operation::PermitWrite:
			case Operation::SelectByte | Operation::PermitWrite | Operation::PermitRead:
				*target = value->b;
			break;
		}
	}